

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.c
# Opt level: O0

void init_player(void)

{
  player_upkeep *ppVar1;
  object **ppoVar2;
  int16_t *piVar3;
  object *poVar4;
  _Bool *p_Var5;
  curse_data *pcVar6;
  
  player = (player *)mem_zalloc(0x4c8);
  ppVar1 = (player_upkeep *)mem_zalloc(0x98);
  player->upkeep = ppVar1;
  ppoVar2 = (object **)mem_zalloc((long)(int)(z_info->pack_size + 1) << 3);
  player->upkeep->inven = ppoVar2;
  ppoVar2 = (object **)mem_zalloc((ulong)z_info->quiver_size << 3);
  player->upkeep->quiver = ppoVar2;
  piVar3 = (int16_t *)mem_zalloc(0x6a);
  player->timed = piVar3;
  poVar4 = object_new();
  player->obj_k = poVar4;
  p_Var5 = (_Bool *)mem_zalloc((ulong)z_info->brand_max);
  player->obj_k->brands = p_Var5;
  p_Var5 = (_Bool *)mem_zalloc((ulong)z_info->slay_max);
  player->obj_k->slays = p_Var5;
  pcVar6 = (curse_data *)mem_zalloc((ulong)z_info->curse_max << 3);
  player->obj_k->curses = pcVar6;
  options_init_defaults(&player->opts);
  return;
}

Assistant:

static void init_player(void) {
	/* Create the player array, initialised with 0 */
	player = mem_zalloc(sizeof *player);

	/* Allocate player sub-structs */
	player->upkeep = mem_zalloc(sizeof(struct player_upkeep));
	player->upkeep->inven = mem_zalloc((z_info->pack_size + 1) * sizeof(struct object *));
	player->upkeep->quiver = mem_zalloc(z_info->quiver_size * sizeof(struct object *));
	player->timed = mem_zalloc(TMD_MAX * sizeof(int16_t));
	player->obj_k = object_new();
	player->obj_k->brands = mem_zalloc(z_info->brand_max * sizeof(bool));
	player->obj_k->slays = mem_zalloc(z_info->slay_max * sizeof(bool));
	player->obj_k->curses = mem_zalloc(z_info->curse_max *
									   sizeof(struct curse_data));

	options_init_defaults(&player->opts);
}